

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::ProjectionLight::PDF_Le(ProjectionLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  Float FVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float n2;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float z;
  undefined1 auVar17 [16];
  Tuple2<pbrt::Point2,_float> local_18;
  
  *pdfPos = 0.0;
  fVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar14 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar14),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                   [1])),ZEXT416((uint)fVar3),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar14),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar14),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar14 = auVar7._0_4_;
  fVar5 = auVar17._0_4_;
  fVar16 = auVar6._0_4_;
  fVar3 = fVar14 * fVar14 + fVar5 * fVar5 + fVar16 * fVar16;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    auVar6 = ZEXT416((uint)fVar16);
    auVar7 = ZEXT416((uint)fVar14);
  }
  else {
    auVar17 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    fVar3 = auVar17._0_4_;
  }
  auVar17._0_4_ = auVar6._0_4_ / fVar3;
  auVar17._4_12_ = auVar6._4_12_;
  if (this->hither <= auVar17._0_4_) {
    fVar5 = fVar5 / fVar3;
    auVar9._0_4_ = auVar7._0_4_ / fVar3;
    auVar9._4_12_ = auVar7._4_12_;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->screenFromLight).m.m[3][1])),auVar9,
                             ZEXT416((uint)(this->screenFromLight).m.m[3][0]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar17,ZEXT416((uint)(this->screenFromLight).m.m[3][2]));
    fVar3 = auVar7._0_4_ + (this->screenFromLight).m.m[3][3];
    auVar7 = vinsertps_avx(*(undefined1 (*) [16])((this->screenFromLight).m.m[0] + 1),
                           ZEXT416((uint)(this->screenFromLight).m.m[1][1]),0x10);
    auVar6._0_4_ = fVar5 * auVar7._0_4_;
    auVar6._4_4_ = fVar5 * auVar7._4_4_;
    auVar6._8_4_ = fVar5 * auVar7._8_4_;
    auVar6._12_4_ = fVar5 * auVar7._12_4_;
    auVar7 = vinsertps_avx((undefined1  [16])(this->screenFromLight).m.m[0],
                           ZEXT416((uint)(this->screenFromLight).m.m[1][0]),0x10);
    auVar10._4_4_ = auVar9._0_4_;
    auVar10._0_4_ = auVar9._0_4_;
    auVar10._8_4_ = auVar9._0_4_;
    auVar10._12_4_ = auVar9._0_4_;
    auVar6 = vfmadd213ps_fma(auVar10,auVar7,auVar6);
    auVar7 = vinsertps_avx(*(undefined1 (*) [16])((this->screenFromLight).m.m[0] + 2),
                           ZEXT416((uint)(this->screenFromLight).m.m[1][2]),0x10);
    auVar15._4_4_ = auVar17._0_4_;
    auVar15._0_4_ = auVar17._0_4_;
    auVar15._8_4_ = auVar17._0_4_;
    auVar15._12_4_ = auVar17._0_4_;
    auVar6 = vfmadd213ps_fma(auVar15,auVar7,auVar6);
    auVar7 = vinsertps_avx(*(undefined1 (*) [16])((this->screenFromLight).m.m[0] + 3),
                           ZEXT416((uint)(this->screenFromLight).m.m[1][3]),0x10);
    auVar11._0_4_ = auVar7._0_4_ + auVar6._0_4_;
    auVar11._4_4_ = auVar7._4_4_ + auVar6._4_4_;
    auVar11._8_4_ = auVar7._8_4_ + auVar6._8_4_;
    auVar11._12_4_ = auVar7._12_4_ + auVar6._12_4_;
    auVar7._4_4_ = fVar3;
    auVar7._0_4_ = fVar3;
    auVar7._8_4_ = fVar3;
    auVar7._12_4_ = fVar3;
    auVar7 = vdivps_avx(auVar11,auVar7);
    if ((fVar3 == 1.0) && (!NAN(fVar3))) {
      auVar7 = auVar11;
    }
    auVar12._8_8_ = auVar7._0_8_;
    auVar12._0_8_ = auVar7._0_8_;
    uVar2 = vcmpps_avx512vl(auVar12,(undefined1  [16])this->screenBounds,2);
    uVar1 = vcmpps_avx512vl((undefined1  [16])this->screenBounds,auVar12,2);
    auVar6 = vpmovm2d_avx512vl(uVar2);
    auVar9 = vpmovm2d_avx512vl(uVar1);
    auVar6 = vpblendd_avx2(auVar9,auVar6,0xc);
    uVar2 = vpmovd2m_avx512vl(auVar6);
    if ((~(ushort)uVar2 & 0xf) == 0) {
      local_18 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7);
      FVar4 = PiecewiseConstant2D::PDF(&this->distrib,(Point2f *)&local_18);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>;
      auVar6 = vsubps_avx(auVar13,auVar8);
      auVar7 = vmovshdup_avx(auVar6);
      *pdfDir = (FVar4 * auVar6._0_4_ * auVar7._0_4_) /
                (auVar17._0_4_ * auVar17._0_4_ * auVar17._0_4_ * this->A);
      return;
    }
  }
  *pdfDir = 0.0;
  return;
}

Assistant:

void ProjectionLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;
    // Transform ray direction to light space and reject invalid ones
    Vector3f w = Normalize(renderFromLight.ApplyInverse(ray.d));
    if (w.z < hither) {
        *pdfDir = 0;
        return;
    }

    // Compute screen space coordinates for direction and test against bounds
    Point3f ps = screenFromLight(Point3f(w));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds)) {
        *pdfDir = 0;
        return;
    }

    *pdfDir = distrib.PDF(Point2f(ps.x, ps.y)) * screenBounds.Area() /
              (A * Pow<3>(CosTheta(w)));
}